

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  int iVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  undefined1 (*pauVar23) [32];
  int iVar24;
  long lVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  ulong uVar28;
  long lVar29;
  undefined4 *puVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  size_t *psVar18;
  
  psVar18 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar18 = &A->cstep;
  }
  iVar1 = (int)*psVar18;
  lVar17 = (long)iVar1;
  lVar20 = (long)(k * iVar1);
  uVar28 = 0;
  iVar24 = 0;
  if (0 < max_kk) {
    iVar24 = max_kk;
  }
  lVar25 = (long)i;
  lVar22 = lVar20 * 4 + lVar25 * 4;
  lVar32 = lVar20 * 4 + lVar25 * 4 + 4;
  lVar26 = lVar25 * 0x20;
  lVar31 = lVar26 + lVar20 * 4;
  lVar25 = lVar25 * 0x10;
  lVar33 = lVar26 + lVar20 * 4 + 0x20;
  local_48 = lVar26 + 0x60 + lVar20 * 4;
  local_38 = lVar26 + 0xe0 + lVar20 * 4;
  lVar26 = lVar25 + lVar20 * 4;
  lVar29 = lVar25 + 0x10 + lVar20 * 4;
  local_50 = lVar25 + 0x30 + lVar20 * 4;
  local_40 = lVar25 + 0x70 + lVar20 * 4;
  pauVar23 = (undefined1 (*) [32])AT->data;
  lVar20 = (long)max_ii;
  lVar25 = (long)(iVar1 * 8) * 4;
  lVar34 = (long)(iVar1 * 4) * 4;
  iVar1 = A->elempack;
  for (; (long)(uVar28 | 7) < lVar20; uVar28 = uVar28 + 8) {
    if (iVar1 == 8) {
      pauVar27 = (undefined1 (*) [32])((long)A->data + local_38);
      for (iVar19 = 7; iVar19 < max_kk; iVar19 = iVar19 + 8) {
        auVar14 = vunpcklps_avx(pauVar27[-7],pauVar27[-6]);
        auVar8 = vunpckhps_avx(pauVar27[-7],pauVar27[-6]);
        auVar15 = vunpcklps_avx(pauVar27[-5],pauVar27[-4]);
        auVar37 = vunpckhps_avx(pauVar27[-5],pauVar27[-4]);
        auVar16 = vunpcklps_avx(pauVar27[-3],pauVar27[-2]);
        auVar36 = vunpckhps_avx(pauVar27[-3],pauVar27[-2]);
        auVar39 = vunpcklps_avx(pauVar27[-1],*pauVar27);
        auVar9 = vunpckhps_avx(pauVar27[-1],*pauVar27);
        auVar38 = vunpcklpd_avx(auVar14,auVar15);
        auVar14 = vunpckhpd_avx(auVar14,auVar15);
        auVar15 = vunpcklpd_avx(auVar8,auVar37);
        auVar8 = vunpckhpd_avx(auVar8,auVar37);
        auVar10 = vunpcklpd_avx(auVar16,auVar39);
        auVar37 = vunpckhpd_avx(auVar16,auVar39);
        auVar16 = vunpcklpd_avx(auVar36,auVar9);
        auVar36 = vunpckhpd_avx(auVar36,auVar9);
        auVar39._16_16_ = auVar10._0_16_;
        auVar39._0_16_ = auVar38._0_16_;
        auVar40._16_16_ = auVar37._0_16_;
        auVar40._0_16_ = auVar14._0_16_;
        auVar41._16_16_ = auVar16._0_16_;
        auVar41._0_16_ = auVar15._0_16_;
        auVar42._16_16_ = auVar36._0_16_;
        auVar42._0_16_ = auVar8._0_16_;
        auVar9 = vperm2f128_avx(auVar38,auVar10,0x31);
        auVar14 = vperm2f128_avx(auVar14,auVar37,0x31);
        auVar37 = vperm2f128_avx(auVar15,auVar16,0x31);
        auVar8 = vperm2f128_avx(auVar8,auVar36,0x31);
        *pauVar23 = auVar39;
        pauVar23[1] = auVar40;
        pauVar23[2] = auVar41;
        pauVar23[3] = auVar42;
        pauVar23[4] = auVar9;
        pauVar23[5] = auVar14;
        pauVar23[6] = auVar37;
        pauVar23[7] = auVar8;
        pauVar23 = pauVar23 + 8;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + lVar25);
      }
    }
    if (iVar1 == 4) {
      pauVar21 = (undefined1 (*) [16])((long)A->data + local_40);
      for (iVar19 = 3; iVar19 < max_kk; iVar19 = iVar19 + 4) {
        auVar11 = vunpcklps_avx(pauVar21[-7],pauVar21[-6]);
        auVar12 = vunpcklps_avx(pauVar21[-5],pauVar21[-4]);
        auVar4 = vunpckhps_avx(pauVar21[-7],pauVar21[-6]);
        auVar5 = vunpckhps_avx(pauVar21[-5],pauVar21[-4]);
        auVar2 = vmovlhps_avx(auVar11,auVar12);
        auVar12 = vunpckhpd_avx(auVar11,auVar12);
        auVar11 = vmovlhps_avx(auVar4,auVar5);
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        auVar5 = vunpcklps_avx(pauVar21[-3],pauVar21[-2]);
        auVar13 = vunpcklps_avx(pauVar21[-1],*pauVar21);
        auVar6 = vunpckhps_avx(pauVar21[-3],pauVar21[-2]);
        auVar7 = vunpckhps_avx(pauVar21[-1],*pauVar21);
        auVar4 = vmovlhps_avx(auVar5,auVar13);
        auVar13 = vunpckhpd_avx(auVar5,auVar13);
        auVar5 = vmovlhps_avx(auVar6,auVar7);
        auVar6 = vunpckhpd_avx(auVar6,auVar7);
        *(undefined1 (*) [16])*pauVar23 = auVar2;
        *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar4;
        *(undefined1 (*) [16])pauVar23[1] = auVar12;
        *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar13;
        *(undefined1 (*) [16])pauVar23[2] = auVar11;
        *(undefined1 (*) [16])(pauVar23[2] + 0x10) = auVar5;
        *(undefined1 (*) [16])pauVar23[3] = auVar3;
        *(undefined1 (*) [16])(pauVar23[3] + 0x10) = auVar6;
        pauVar23 = pauVar23 + 4;
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar34);
      }
    }
    if (iVar1 == 1) {
      pauVar27 = (undefined1 (*) [32])((long)A->data + lVar22);
      iVar19 = iVar24;
      while (bVar35 = iVar19 != 0, iVar19 = iVar19 + -1, bVar35) {
        *pauVar23 = *pauVar27;
        pauVar23 = pauVar23 + 1;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + lVar17 * 4);
      }
    }
    lVar31 = lVar31 + 0x100;
    lVar26 = lVar26 + 0x80;
    lVar22 = lVar22 + 0x20;
    lVar33 = lVar33 + 0x100;
    lVar29 = lVar29 + 0x80;
    lVar32 = lVar32 + 0x20;
    local_48 = local_48 + 0x100;
    local_50 = local_50 + 0x80;
    local_38 = local_38 + 0x100;
    local_40 = local_40 + 0x80;
  }
  for (; (long)(uVar28 | 3) < lVar20; uVar28 = uVar28 + 4) {
    if (iVar1 == 8) {
      pauVar27 = (undefined1 (*) [32])((long)A->data + local_48);
      for (iVar19 = 7; iVar19 < max_kk; iVar19 = iVar19 + 8) {
        auVar14 = vunpcklps_avx(pauVar27[-3],pauVar27[-2]);
        auVar8 = vunpckhps_avx(pauVar27[-3],pauVar27[-2]);
        auVar9 = vunpcklps_avx(pauVar27[-1],*pauVar27);
        auVar37 = vunpckhps_avx(pauVar27[-1],*pauVar27);
        auVar36 = vunpcklpd_avx(auVar14,auVar9);
        auVar14 = vunpckhpd_avx(auVar14,auVar9);
        auVar9 = vunpcklpd_avx(auVar8,auVar37);
        auVar8 = vunpckhpd_avx(auVar8,auVar37);
        auVar37._16_16_ = auVar14._0_16_;
        auVar37._0_16_ = auVar36._0_16_;
        auVar38._16_16_ = auVar8._0_16_;
        auVar38._0_16_ = auVar9._0_16_;
        auVar14 = vperm2f128_avx(auVar36,auVar14,0x31);
        auVar8 = vperm2f128_avx(auVar9,auVar8,0x31);
        *pauVar23 = auVar37;
        pauVar23[1] = auVar38;
        pauVar23[2] = auVar14;
        pauVar23[3] = auVar8;
        pauVar23 = pauVar23 + 4;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + lVar25);
      }
    }
    if (iVar1 == 4) {
      pauVar21 = (undefined1 (*) [16])((long)A->data + local_50);
      for (iVar19 = 3; iVar19 < max_kk; iVar19 = iVar19 + 4) {
        auVar11 = vunpcklps_avx(pauVar21[-3],pauVar21[-2]);
        auVar4 = vunpcklps_avx(pauVar21[-1],*pauVar21);
        auVar5 = vunpckhps_avx(pauVar21[-3],pauVar21[-2]);
        auVar12 = vunpckhps_avx(pauVar21[-1],*pauVar21);
        auVar2 = vmovlhps_avx(auVar11,auVar4);
        auVar4 = vunpckhpd_avx(auVar11,auVar4);
        auVar11 = vmovlhps_avx(auVar5,auVar12);
        auVar5 = vunpckhpd_avx(auVar5,auVar12);
        *(undefined1 (*) [16])*pauVar23 = auVar2;
        *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar4;
        *(undefined1 (*) [16])pauVar23[1] = auVar11;
        *(undefined1 (*) [16])(pauVar23[1] + 0x10) = auVar5;
        pauVar23 = pauVar23 + 2;
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar34);
      }
    }
    if (iVar1 == 1) {
      pauVar21 = (undefined1 (*) [16])((long)A->data + lVar22);
      iVar19 = iVar24;
      while (bVar35 = iVar19 != 0, iVar19 = iVar19 + -1, bVar35) {
        *(undefined1 (*) [16])*pauVar23 = *pauVar21;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar17 * 4);
      }
    }
    lVar31 = lVar31 + 0x80;
    lVar26 = lVar26 + 0x40;
    lVar22 = lVar22 + 0x10;
    lVar33 = lVar33 + 0x80;
    lVar29 = lVar29 + 0x40;
    lVar32 = lVar32 + 0x10;
    local_48 = local_48 + 0x80;
    local_50 = local_50 + 0x40;
  }
  for (; (long)(uVar28 | 1) < lVar20; uVar28 = uVar28 + 2) {
    if (iVar1 == 8) {
      pauVar27 = (undefined1 (*) [32])((long)A->data + lVar33);
      for (iVar19 = 7; iVar19 < max_kk; iVar19 = iVar19 + 8) {
        auVar8 = vunpcklps_avx(pauVar27[-1],*pauVar27);
        auVar14 = vunpckhps_avx(pauVar27[-1],*pauVar27);
        auVar36._16_16_ = auVar14._0_16_;
        auVar36._0_16_ = auVar8._0_16_;
        auVar14 = vperm2f128_avx(auVar8,auVar14,0x31);
        *pauVar23 = auVar36;
        pauVar23[1] = auVar14;
        pauVar23 = pauVar23 + 2;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + lVar25);
      }
    }
    if (iVar1 == 4) {
      pauVar21 = (undefined1 (*) [16])((long)A->data + lVar29);
      for (iVar19 = 3; iVar19 < max_kk; iVar19 = iVar19 + 4) {
        auVar11 = vunpcklps_avx(pauVar21[-1],*pauVar21);
        auVar2 = vunpckhps_avx(pauVar21[-1],*pauVar21);
        *(undefined1 (*) [16])*pauVar23 = auVar11;
        *(undefined1 (*) [16])(*pauVar23 + 0x10) = auVar2;
        pauVar23 = pauVar23 + 1;
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar34);
      }
    }
    if (iVar1 == 1) {
      puVar30 = (undefined4 *)((long)A->data + lVar32);
      iVar19 = iVar24;
      while (bVar35 = iVar19 != 0, iVar19 = iVar19 + -1, bVar35) {
        *(undefined4 *)*pauVar23 = puVar30[-1];
        *(undefined4 *)(*pauVar23 + 4) = *puVar30;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 8);
        puVar30 = puVar30 + lVar17;
      }
    }
    lVar31 = lVar31 + 0x40;
    lVar26 = lVar26 + 0x20;
    lVar22 = lVar22 + 8;
    lVar33 = lVar33 + 0x40;
    lVar29 = lVar29 + 0x20;
    lVar32 = lVar32 + 8;
  }
  for (; (long)uVar28 < lVar20; uVar28 = uVar28 + 1) {
    if (iVar1 == 8) {
      pauVar27 = (undefined1 (*) [32])((long)A->data + lVar31);
      for (iVar19 = 7; iVar19 < max_kk; iVar19 = iVar19 + 8) {
        *pauVar23 = *pauVar27;
        pauVar23 = pauVar23 + 1;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + lVar25);
      }
    }
    if (iVar1 == 4) {
      pauVar21 = (undefined1 (*) [16])((long)A->data + lVar26);
      for (iVar19 = 3; iVar19 < max_kk; iVar19 = iVar19 + 4) {
        *(undefined1 (*) [16])*pauVar23 = *pauVar21;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 0x10);
        pauVar21 = (undefined1 (*) [16])(*pauVar21 + lVar34);
      }
    }
    if (iVar1 == 1) {
      puVar30 = (undefined4 *)((long)A->data + lVar22);
      iVar19 = iVar24;
      while (bVar35 = iVar19 != 0, iVar19 = iVar19 + -1, bVar35) {
        *(undefined4 *)*pauVar23 = *puVar30;
        pauVar23 = (undefined1 (*) [32])(*pauVar23 + 4);
        puVar30 = puVar30 + lVar17;
      }
    }
    lVar31 = lVar31 + 0x20;
    lVar26 = lVar26 + 0x10;
    lVar22 = lVar22 + 4;
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}